

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v256_intrinsics_c.h
# Opt level: O3

c_v256 * c_v256_pack_s16_s8(c_v256 a,c_v256 b)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  c_v256 cVar7;
  c_v256 *in_RDI;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  
  auVar11._8_8_ = 0;
  auVar11._0_8_ = a.u64[3];
  auVar9._8_8_ = 0;
  auVar9._0_8_ = a.u64[1];
  auVar11 = vpunpcklqdq_avx(auVar9,auVar11);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = b.u64[3];
  auVar10._8_8_ = 0;
  auVar10._0_8_ = b.u64[1];
  auVar9 = vpunpcklqdq_avx(auVar10,auVar17);
  auVar12._0_16_ = ZEXT116(0) * auVar11 + ZEXT116(1) * auVar9;
  auVar12._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar11;
  auVar14 = vpsrlvq_avx2(auVar12,_DAT_00bf14a0);
  auVar11 = vshufps_avx(auVar14._0_16_,auVar14._16_16_,0x88);
  auVar11 = vpsrad_avx(auVar11,0x10);
  auVar8._8_4_ = 0xffffff80;
  auVar8._0_8_ = 0xffffff80ffffff80;
  auVar8._12_4_ = 0xffffff80;
  auVar11 = vpmaxsd_avx(auVar11,auVar8);
  auVar14 = vpsrlvq_avx2(auVar12,_DAT_00bf14c0);
  auVar9 = vshufps_avx(auVar14._0_16_,auVar14._16_16_,0x88);
  auVar9 = vpsrad_avx(auVar9,0x10);
  auVar17 = vpmaxsd_avx(auVar9,auVar8);
  auVar9 = vpinsrq_avx((undefined1  [16])b.v128[0],b.u64[2],1);
  auVar14._8_8_ = a.u64[0];
  auVar14._0_8_ = a._0_8_;
  auVar14._16_8_ = a.u64[0];
  auVar14._24_8_ = a.u64[0];
  auVar14 = vpblendd_avx2(ZEXT1632(auVar9),auVar14,0x30);
  auVar13._8_8_ = a.u64[2];
  auVar13._0_8_ = a._16_8_;
  auVar13._16_8_ = a.u64[2];
  auVar13._24_8_ = a.u64[2];
  auVar14 = vpblendd_avx2(auVar14,auVar13,0xc0);
  auVar5 = vshufps_avx(auVar9,auVar14._16_16_,0x88);
  auVar16._8_4_ = 0x7f;
  auVar16._0_8_ = 0x7f0000007f;
  auVar16._12_4_ = 0x7f;
  auVar10 = vpminsd_avx(auVar11,auVar16);
  auVar11 = vpinsrd_avx(ZEXT416(b.u32[2]),b.u32[6],1);
  auVar11 = vpinsrd_avx(auVar11,a.u32[2],2);
  auVar11 = vpinsrd_avx(auVar11,a.u32[6],3);
  auVar1 = vpminsd_avx(auVar17,auVar16);
  auVar17 = vpsrad_avx(auVar11,0x10);
  auVar17 = vpmaxsd_avx(auVar17,auVar8);
  auVar17 = vpminsd_avx(auVar17,auVar16);
  auVar11 = vpslld_avx(auVar11,0x10);
  auVar11 = vpsrad_avx(auVar11,0x10);
  auVar11 = vpmaxsd_avx(auVar11,auVar8);
  auVar2 = vpminsd_avx(auVar11,auVar16);
  auVar11 = vshufps_avx(auVar9,auVar14._16_16_,0xdd);
  auVar11 = vpsrad_avx(auVar11,0x10);
  auVar11 = vpmaxsd_avx(auVar11,auVar8);
  auVar9 = vpminsd_avx(auVar11,auVar16);
  auVar14 = vpsrlq_avx2(auVar14,0x10);
  auVar11 = vshufps_avx(auVar14._0_16_,auVar14._16_16_,0x88);
  auVar11 = vpsrad_avx(auVar11,0x10);
  auVar11 = vpmaxsd_avx(auVar11,auVar8);
  auVar3 = vpminsd_avx(auVar11,auVar16);
  auVar11 = vpsrad_avx(auVar5,0x10);
  auVar11 = vpmaxsd_avx(auVar11,auVar8);
  auVar4 = vpminsd_avx(auVar11,auVar16);
  auVar11 = vpslld_avx(auVar5,0x10);
  auVar11 = vpsrad_avx(auVar11,0x10);
  auVar11 = vpmaxsd_avx(auVar11,auVar8);
  auVar5 = vpminsd_avx(auVar11,auVar16);
  auVar15._8_4_ = 0xff;
  auVar15._0_8_ = 0xff000000ff;
  auVar15._12_4_ = 0xff;
  auVar11 = vpand_avx(auVar10,auVar15);
  auVar14 = vpmovzxdq_avx2(auVar11);
  auVar12 = vpsllvq_avx2(auVar14,_DAT_00bf14e0);
  auVar11 = vpand_avx(auVar1,auVar15);
  auVar14 = vpmovzxdq_avx2(auVar11);
  auVar14 = vpsllvq_avx2(auVar14,_DAT_00bf1500);
  auVar13 = vpor_avx2(auVar14,auVar12);
  auVar11 = vpand_avx(auVar17,auVar15);
  auVar14 = vpmovzxdq_avx2(auVar11);
  auVar12 = vpsllq_avx2(auVar14,0x28);
  auVar11 = vpand_avx(auVar2,auVar15);
  auVar14 = vpmovzxdq_avx2(auVar11);
  auVar14 = vpsllq_avx2(auVar14,0x20);
  auVar12 = vpor_avx2(auVar12,auVar14);
  auVar11 = vpslld_avx(auVar9,0x18);
  auVar14 = vpmovzxdq_avx2(auVar11);
  auVar12 = vpor_avx2(auVar12,auVar14);
  auVar11 = vpshufb_avx(auVar3,_DAT_00bef6e0);
  auVar14 = vpmovzxdq_avx2(auVar11);
  auVar6 = vpor_avx2(auVar12,auVar14);
  auVar11 = vpand_avx(auVar5,auVar15);
  auVar14 = vpmovzxdq_avx2(auVar11);
  auVar11 = vpshufb_avx(auVar4,_DAT_00bef6f0);
  auVar12 = vpmovzxdq_avx2(auVar11);
  auVar12 = vpor_avx2(auVar6,auVar12);
  auVar14 = vpor_avx2(auVar12,auVar14);
  cVar7 = (c_v256)vpor_avx2(auVar13,auVar14);
  *in_RDI = cVar7;
  return in_RDI;
}

Assistant:

SIMD_INLINE c_v256 c_v256_pack_s16_s8(c_v256 a, c_v256 b) {
  return c_v256_from_v128(c_v128_pack_s16_s8(a.v128[1], a.v128[0]),
                          c_v128_pack_s16_s8(b.v128[1], b.v128[0]));
}